

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  ZSTD_prefixDict *pZVar1;
  ZSTD_dictContentType_e dictContentType;
  void *pvVar2;
  void *dict;
  void *pvVar3;
  ZSTD_customMem customMem;
  ZSTD_customMem cMem;
  ZSTD_CCtx_params params;
  bool bVar4;
  undefined8 uVar5;
  int iVar6;
  U32 UVar7;
  ZSTD_CDict *pZVar8;
  ZSTDMT_CCtx *mtctx;
  size_t sVar9;
  size_t sVar10;
  ZSTD_paramSwitch_e ZVar11;
  long lVar12;
  U64 srcSizeHint;
  ZSTD_CCtx_params *pZVar13;
  undefined8 *puVar14;
  ZSTD_cParamMode_e mode;
  unsigned_long_long pledgedSrcSize;
  bool bVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar24;
  uint uVar25;
  undefined1 auVar22 [16];
  uint uVar26;
  undefined1 auVar23 [16];
  ZSTD_allocFunction in_stack_fffffffffffffdf8;
  ZSTD_freeFunction in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined1 auVar27 [12];
  undefined1 auVar28 [24];
  undefined1 auVar29 [24];
  undefined1 in_stack_fffffffffffffe10 [184];
  ZSTD_CCtx_params local_120;
  undefined1 local_4c [28];
  
  bVar16 = 0;
  memcpy(&local_120,&cctx->requestedParams,0xd0);
  pZVar1 = &cctx->prefixDict;
  pvVar2 = (cctx->localDict).dict;
  dict = (cctx->prefixDict).dict;
  sVar10 = (cctx->prefixDict).dictSize;
  dictContentType = (cctx->prefixDict).dictContentType;
  if (pvVar2 == (void *)0x0) {
    if ((cctx->localDict).dictBuffer != (void *)0x0) {
      __assert_fail("dl->dictBuffer == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5595,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("dl->cdict == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5596,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).dictSize != 0) {
      __assert_fail("dl->dictSize == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5597,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
LAB_00184777:
    pZVar1->dict = (void *)0x0;
    pZVar1->dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    pZVar8 = cctx->cdict;
    bVar15 = pZVar8 == (ZSTD_CDict *)0x0;
    if (dict == (void *)0x0) {
      bVar4 = true;
      if (pvVar2 == (void *)0x0 && pZVar8 != (ZSTD_CDict *)0x0) {
        local_120.compressionLevel = pZVar8->compressionLevel;
        bVar15 = false;
      }
    }
    else {
      if (pZVar8 != (ZSTD_CDict *)0x0) {
        __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6898,
                      "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                     );
      }
      bVar15 = true;
      bVar4 = false;
      pZVar8 = (ZSTD_CDict *)0x0;
    }
  }
  else {
    pZVar8 = (cctx->localDict).cdict;
    if (pZVar8 != (ZSTD_CDict *)0x0) {
      if (cctx->cdict != pZVar8) {
        __assert_fail("cctx->cdict == dl->cdict",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x559c,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      goto LAB_00184777;
    }
    sVar9 = (cctx->localDict).dictSize;
    if (sVar9 == 0) {
      __assert_fail("dl->dictSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x559f,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if (cctx->cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("cctx->cdict == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x55a0,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if (dict != (void *)0x0) {
      __assert_fail("cctx->prefixDict.dict == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x55a1,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    pvVar3 = (cctx->customMem).opaque;
    in_stack_fffffffffffffe08 = SUB84(pvVar3,0);
    in_stack_fffffffffffffe0c = (undefined4)((ulong)pvVar3 >> 0x20);
    in_stack_fffffffffffffdf8 = (cctx->customMem).customAlloc;
    in_stack_fffffffffffffe00 = (cctx->customMem).customFree;
    customMem.opaque._4_4_ = in_stack_fffffffffffffe0c;
    customMem._0_20_ = *(undefined1 (*) [20])&cctx->customMem;
    pZVar8 = ZSTD_createCDict_advanced2
                       (pvVar2,sVar9,ZSTD_dlm_byRef,(cctx->localDict).dictContentType,
                        &cctx->requestedParams,customMem);
    (cctx->localDict).cdict = pZVar8;
    if (pZVar8 == (ZSTD_CDict *)0x0) {
      return 0xffffffffffffffc0;
    }
    cctx->cdict = pZVar8;
    pZVar1->dict = (void *)0x0;
    pZVar1->dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    bVar4 = true;
    bVar15 = false;
  }
  if (endOp == ZSTD_e_end) {
    cctx->pledgedSrcSizePlusOne = inSize + 1;
  }
  if (bVar4) {
    if (bVar15) {
      srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
      sVar9 = 0;
    }
    else {
      srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
      sVar9 = pZVar8->dictContentSize;
LAB_001848f8:
      mode = ZSTD_cpm_attachDict;
      if ((pZVar8->matchState).dedicatedDictSearch != 0) goto LAB_0018490e;
      if ((srcSizeHint == 0xffffffffffffffff) ||
         (srcSizeHint <= attachDictSizeCutoffs[(pZVar8->matchState).cParams.strategy])) {
        if (local_120.attachDictPref != ZSTD_dictForceCopy && local_120.forceWindow == 0)
        goto LAB_0018490e;
      }
      else if (local_120.attachDictPref == ZSTD_dictForceAttach && local_120.forceWindow == 0)
      goto LAB_0018490e;
    }
  }
  else {
    srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
    sVar9 = sVar10;
    if (!bVar15) goto LAB_001848f8;
  }
  mode = ZSTD_cpm_noAttachDict;
LAB_0018490e:
  ZSTD_getCParamsFromCCtxParams
            ((ZSTD_compressionParameters *)local_4c,&local_120,srcSizeHint,sVar9,mode);
  auVar22._4_12_ = local_4c._16_12_;
  auVar22._0_4_ = local_4c._12_4_;
  local_120.cParams.minMatch = local_4c._16_4_;
  local_120.cParams.targetLength = local_4c._20_4_;
  local_120.cParams.strategy = local_4c._24_4_;
  local_120.cParams.windowLog = local_4c._0_4_;
  local_120.cParams.chainLog = local_4c._4_4_;
  uVar5 = local_120.cParams._0_8_;
  local_120.cParams.windowLog = (uint)local_4c._0_8_;
  if ((local_120.useBlockSplitter == ZSTD_ps_auto) &&
     (local_120.useBlockSplitter = ZSTD_ps_disable, ZSTD_btlazy2 < local_120.cParams.strategy)) {
    local_120.useBlockSplitter = (local_120.cParams.windowLog < 0x11) + ZSTD_ps_enable;
  }
  if ((local_120.ldmParams.enableLdm == ZSTD_ps_auto) &&
     (local_120.ldmParams.enableLdm = ZSTD_ps_disable, ZSTD_btlazy2 < local_120.cParams.strategy)) {
    local_120.ldmParams.enableLdm = (local_120.cParams.windowLog < 0x1b) + ZSTD_ps_enable;
  }
  if ((local_120.useRowMatchFinder == ZSTD_ps_auto) &&
     (local_120.useRowMatchFinder = ZSTD_ps_disable,
     0xfffffffc < local_120.cParams.strategy - ZSTD_btlazy2)) {
    local_120.useRowMatchFinder = (local_120.cParams.windowLog < 0xf) + ZSTD_ps_enable;
  }
  sVar9 = 0x20000;
  if (local_120.maxBlockSize != 0) {
    sVar9 = local_120.maxBlockSize;
  }
  local_120.maxBlockSize = sVar9;
  ZVar11 = (local_120.compressionLevel < 10) + ZSTD_ps_enable;
  if (local_120.searchForExternalRepcodes != ZSTD_ps_auto) {
    ZVar11 = local_120.searchForExternalRepcodes;
  }
  local_120.searchForExternalRepcodes = ZVar11;
  if (local_120.useSequenceProducer == 1 && 0 < local_120.nbWorkers) {
    return 0xffffffffffffffd7;
  }
  pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
  local_120.cParams._0_8_ = uVar5;
  if (pledgedSrcSize < 0x80001) {
    local_120.nbWorkers = 0;
  }
  else if (0 < local_120.nbWorkers) {
    mtctx = cctx->mtctx;
    if (mtctx == (ZSTDMT_CCtx *)0x0) {
      pvVar2 = (cctx->customMem).opaque;
      in_stack_fffffffffffffe08 = SUB84(pvVar2,0);
      in_stack_fffffffffffffe0c = (undefined4)((ulong)pvVar2 >> 0x20);
      in_stack_fffffffffffffdf8 = (cctx->customMem).customAlloc;
      in_stack_fffffffffffffe00 = (cctx->customMem).customFree;
      cMem.opaque._4_4_ = in_stack_fffffffffffffe0c;
      cMem._0_20_ = *(undefined1 (*) [20])&cctx->customMem;
      mtctx = ZSTDMT_createCCtx_advanced(local_120.nbWorkers,cMem,cctx->pool);
      cctx->mtctx = mtctx;
      if (mtctx == (ZSTDMT_CCtx *)0x0) {
        return 0xffffffffffffffc0;
      }
      pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
    }
    pZVar8 = cctx->cdict;
    pZVar13 = &local_120;
    puVar14 = (undefined8 *)&stack0xfffffffffffffdf8;
    for (lVar12 = 0x1a; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar14 = *(undefined8 *)pZVar13;
      pZVar13 = (ZSTD_CCtx_params *)((long)pZVar13 + ((ulong)bVar16 * -2 + 1) * 8);
      puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
    }
    params.cParams._4_8_ = in_stack_fffffffffffffe00;
    params._0_8_ = in_stack_fffffffffffffdf8;
    params.cParams.searchLog = in_stack_fffffffffffffe08;
    params.cParams.minMatch = in_stack_fffffffffffffe0c;
    auVar27 = in_stack_fffffffffffffe10._8_12_;
    auVar28 = in_stack_fffffffffffffe10._72_24_;
    auVar29 = in_stack_fffffffffffffe10._128_24_;
    params.cParams.targetLength = in_stack_fffffffffffffe10._0_4_;
    params.cParams.strategy = in_stack_fffffffffffffe10._4_4_;
    params.fParams.contentSizeFlag = auVar27._0_4_;
    params.fParams.checksumFlag = auVar27._4_4_;
    params.fParams.noDictIDFlag = auVar27._8_4_;
    params.compressionLevel = in_stack_fffffffffffffe10._20_4_;
    params.forceWindow = in_stack_fffffffffffffe10._24_4_;
    params._52_4_ = in_stack_fffffffffffffe10._28_4_;
    params.targetCBlockSize = in_stack_fffffffffffffe10._32_8_;
    params.srcSizeHint = in_stack_fffffffffffffe10._40_4_;
    params.attachDictPref = in_stack_fffffffffffffe10._44_4_;
    params.literalCompressionMode = in_stack_fffffffffffffe10._48_4_;
    params.nbWorkers = in_stack_fffffffffffffe10._52_4_;
    params.jobSize = in_stack_fffffffffffffe10._56_8_;
    params.overlapLog = in_stack_fffffffffffffe10._64_4_;
    params.rsyncable = in_stack_fffffffffffffe10._68_4_;
    params.ldmParams.enableLdm = auVar28._0_4_;
    params.ldmParams.hashLog = auVar28._4_4_;
    params.ldmParams.bucketSizeLog = auVar28._8_4_;
    params.ldmParams.minMatchLength = auVar28._12_4_;
    params.ldmParams.hashRateLog = auVar28._16_4_;
    params.ldmParams.windowLog = auVar28._20_4_;
    params.enableDedicatedDictSearch = in_stack_fffffffffffffe10._96_4_;
    params.inBufferMode = in_stack_fffffffffffffe10._100_4_;
    params.outBufferMode = in_stack_fffffffffffffe10._104_4_;
    params.blockDelimiters = in_stack_fffffffffffffe10._108_4_;
    params.validateSequences = in_stack_fffffffffffffe10._112_4_;
    params.useBlockSplitter = in_stack_fffffffffffffe10._116_4_;
    params.useRowMatchFinder = in_stack_fffffffffffffe10._120_4_;
    params.deterministicRefPrefix = in_stack_fffffffffffffe10._124_4_;
    params.customMem.customAlloc = (ZSTD_allocFunction)auVar29._0_8_;
    params.customMem.customFree = (ZSTD_freeFunction)auVar29._8_8_;
    params.customMem.opaque = (void *)auVar29._16_8_;
    params.prefetchCDictTables = in_stack_fffffffffffffe10._152_4_;
    params.enableMatchFinderFallback = in_stack_fffffffffffffe10._156_4_;
    params.useSequenceProducer = in_stack_fffffffffffffe10._160_4_;
    params._188_4_ = in_stack_fffffffffffffe10._164_4_;
    params.maxBlockSize = in_stack_fffffffffffffe10._168_8_;
    params.searchForExternalRepcodes = in_stack_fffffffffffffe10._176_4_;
    params._204_4_ = in_stack_fffffffffffffe10._180_4_;
    sVar9 = ZSTDMT_initCStream_internal
                      (mtctx,dict,sVar10,dictContentType,pZVar8,params,pledgedSrcSize);
    if (sVar9 < 0xffffffffffffff89) {
      pZVar8 = cctx->cdict;
      if (pZVar8 == (ZSTD_CDict *)0x0) {
        UVar7 = 0;
      }
      else {
        UVar7 = pZVar8->dictID;
        sVar10 = pZVar8->dictContentSize;
      }
      cctx->dictID = UVar7;
      cctx->dictContentSize = sVar10;
      cctx->consumedSrcSize = 0;
      cctx->producedCSize = 0;
      cctx->streamStage = zcss_load;
      memcpy(&cctx->appliedParams,&local_120,0xd0);
      return 0;
    }
    return sVar9;
  }
  local_120.cParams.chainLog = SUB84(local_4c._0_8_,4);
  uVar17 = local_120.cParams.windowLog - 0x20;
  uVar18 = local_120.cParams.chainLog - 0x1f;
  uVar19 = local_4c._8_4_ - 0x1f;
  uVar20 = local_4c._12_4_ - 0x1f;
  auVar22 = pmovsxbd(auVar22,0xe1e6e6e9);
  uVar21 = auVar22._0_4_;
  uVar24 = auVar22._4_4_;
  uVar25 = auVar22._8_4_;
  uVar26 = auVar22._12_4_;
  auVar23._0_4_ = -(uint)(((uVar17 < uVar21) * uVar17 | (uVar17 >= uVar21) * uVar21) == uVar17);
  auVar23._4_4_ = -(uint)(((uVar18 < uVar24) * uVar18 | (uVar18 >= uVar24) * uVar24) == uVar18);
  auVar23._8_4_ = -(uint)(((uVar19 < uVar25) * uVar19 | (uVar19 >= uVar25) * uVar25) == uVar19);
  auVar23._12_4_ = -(uint)(((uVar20 < uVar26) * uVar20 | (uVar20 >= uVar26) * uVar26) == uVar20);
  iVar6 = movmskps(0xffffffd7,auVar23);
  if ((((iVar6 != 0) || (4 < local_120.cParams.minMatch - 3)) ||
      (0x20000 < local_120.cParams.targetLength)) || (8 < local_120.cParams.strategy - ZSTD_fast)) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x68d8,
                  "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)");
  }
  sVar10 = ZSTD_compressBegin_internal
                     (cctx,dict,sVar10,dictContentType,ZSTD_dtlm_fast,cctx->cdict,&local_120,
                      pledgedSrcSize,ZSTDb_buffered);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  if ((cctx->appliedParams).nbWorkers == 0) {
    cctx->inToCompress = 0;
    cctx->inBuffPos = 0;
    if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      sVar10 = (ulong)(cctx->blockSize == pledgedSrcSize) + cctx->blockSize;
    }
    else {
      sVar10 = 0;
    }
    cctx->inBuffTarget = sVar10;
    cctx->outBuffContentSize = 0;
    cctx->outBuffFlushedSize = 0;
    cctx->streamStage = zcss_load;
    cctx->frameEnded = 0;
    return 0;
  }
  __assert_fail("cctx->appliedParams.nbWorkers == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x68de,
                "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)");
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize)
{
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-determine pledgedSrcSize */

    {   size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    params.useBlockSplitter = ZSTD_resolveBlockSplitterMode(params.useBlockSplitter, &params.cParams);
    params.ldmParams.enableLdm = ZSTD_resolveEnableLdm(params.ldmParams.enableLdm, &params.cParams);
    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);
    params.validateSequences = ZSTD_resolveExternalSequenceValidation(params.validateSequences);
    params.maxBlockSize = ZSTD_resolveMaxBlockSize(params.maxBlockSize);
    params.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(params.searchForExternalRepcodes, params.compressionLevel);

#ifdef ZSTD_MULTITHREAD
    /* If external matchfinder is enabled, make sure to fail before checking job size (for consistency) */
    RETURN_ERROR_IF(
        params.useSequenceProducer == 1 && params.nbWorkers >= 1,
        parameter_combination_unsupported,
        "External sequence producer isn't supported with nbWorkers >= 1"
    );

    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif  /* ZSTD_MULTITHREAD */
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}